

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeries.cpp
# Opt level: O3

void __thiscall
OpenMD::InversePowerSeries::calcForce(InversePowerSeries *this,InteractionData *idat)

{
  double dVar1;
  pointer piVar2;
  undefined1 auVar3 [16];
  uint i;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  vector<int,_std::allocator<int>_> powers;
  vector<double,_std::allocator<double>_> coefficients;
  Vector<double,_3U> result;
  Vector<double,_3U> result_1;
  vector<int,_std::allocator<int>_> local_100;
  double local_e8;
  double dStack_e0;
  vector<double,_std::allocator<double>_> local_d0;
  undefined1 local_b8 [16];
  double local_a8 [4];
  double local_88 [4];
  double local_68;
  double dStack_60;
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar2 = (this->InversePowerSeriesTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar2[idat->atid1]].
                    super__Vector_base<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar7 = (long)piVar2[idat->atid2] * 0x30;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_100,(vector<int,_std::allocator<int>_> *)(lVar4 + lVar7));
  std::vector<double,_std::allocator<double>_>::vector
            (&local_d0,(vector<double,_std::allocator<double>_> *)(lVar4 + lVar7 + 0x18));
  if (local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    dVar11 = 0.0;
    dVar12 = 0.0;
    uVar8 = 0;
    uVar9 = 0;
    dVar13 = 0.0;
  }
  else {
    auVar3._8_4_ = SUB84(idat->rcut,0);
    auVar3._0_8_ = idat->rij;
    auVar3._12_4_ = (int)((ulong)idat->rcut >> 0x20);
    local_b8 = divpd(_DAT_0025fef0,auVar3);
    local_68 = local_b8._8_8_;
    dVar11 = 0.0;
    dVar12 = 0.0;
    uVar5 = 1;
    uVar6 = 0;
    dVar13 = 0.0;
    dVar14 = 0.0;
    dStack_60 = local_68;
    do {
      local_e8 = local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6];
      dStack_e0 = 0.0;
      local_48 = dVar13;
      dStack_40 = dVar14;
      local_38 = dVar11;
      dStack_30 = dVar12;
      dVar11 = pow((double)local_b8._0_8_,
                   (double)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar6]);
      local_58._8_4_ = extraout_XMM0_Dc;
      local_58._0_8_ = dVar11;
      local_58._12_4_ = extraout_XMM0_Dd;
      dStack_e0 = local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6];
      dVar12 = pow(local_68,(double)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar6]);
      dVar13 = local_48 + (double)local_58._0_8_ * local_e8;
      dVar14 = dStack_40 + dVar12 * dStack_e0;
      dVar11 = local_38 -
               (double)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar6] * (double)local_58._0_8_ * local_e8 *
               (double)local_b8._0_8_;
      dVar12 = dStack_30 -
               (double)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar6] * dVar12 * dStack_e0 *
               (double)local_b8._8_8_;
      uVar6 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar6 < (ulong)((long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
    uVar8 = SUB84(dVar14,0);
    uVar9 = (undefined4)((ulong)dVar14 >> 0x20);
  }
  dVar14 = 0.0;
  if (idat->shiftedPot == false) {
    dVar10 = 0.0;
    if (idat->shiftedForce == true) {
      dVar10 = dVar12 * (idat->rij - idat->rcut) + (double)CONCAT44(uVar9,uVar8);
      dVar14 = dVar12;
    }
  }
  else {
    dVar10 = (double)CONCAT44(uVar9,uVar8);
  }
  dVar12 = idat->sw;
  dVar1 = idat->vdwMult;
  dVar13 = (dVar13 - dVar10) * dVar1;
  idat->vpair = idat->vpair + dVar13;
  dVar13 = dVar13 * dVar12;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar13;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar13 + (idat->selePot).data_[1];
  }
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  lVar4 = 0;
  do {
    local_a8[lVar4] =
         (idat->d).super_Vector<double,_3U>.data_[lVar4] * (dVar11 - dVar14) * dVar1 * dVar12;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  dVar11 = idat->rij;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  lVar4 = 0;
  do {
    local_88[lVar4] = local_a8[lVar4] / dVar11;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  lVar4 = 0;
  do {
    (idat->f1).super_Vector<double,_3U>.data_[lVar4] =
         local_88[lVar4] + (idat->f1).super_Vector<double,_3U>.data_[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void InversePowerSeries::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    InversePowerSeriesInteractionData& mixer =
        MixingMap[InversePowerSeriesTids[idat.atid1]]
                 [InversePowerSeriesTids[idat.atid2]];
    std::vector<int> powers            = mixer.powers;
    std::vector<RealType> coefficients = mixer.coefficients;

    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    RealType ri  = 1.0 / idat.rij;
    RealType ric = 1.0 / idat.rcut;

    RealType fn, fnc;

    for (unsigned int i = 0; i < powers.size(); i++) {
      fn  = coefficients[i] * pow(ri, powers[i]);
      fnc = coefficients[i] * pow(ric, powers[i]);
      myPot += fn;
      myPotC += fnc;
      myDeriv -= powers[i] * fn * ri;
      myDerivC -= powers[i] * fnc * ric;
    }

    if (idat.shiftedPot) {
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      myPotC = myPotC + myDerivC * (idat.rij - idat.rcut);
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType pot_temp = idat.vdwMult * (myPot - myPotC);
    idat.vpair += pot_temp;

    RealType dudr = idat.sw * idat.vdwMult * (myDeriv - myDerivC);

    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    idat.f1 += idat.d * dudr / idat.rij;

    return;
  }